

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O1

any __thiscall cs_impl::fiber::Channel<cs_impl::any>::pop(Channel<cs_impl::any> *this)

{
  _List_node_base *p_Var1;
  routine_t rVar2;
  _List_node_base *in_RSI;
  any obj;
  any local_28;
  
  if (*(int *)&in_RSI[1]._M_prev == 0) {
    rVar2 = current();
    *(routine_t *)&in_RSI[1]._M_prev = rVar2;
  }
  while (p_Var1 = (((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&in_RSI->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var1 == in_RSI) {
    yield();
  }
  local_28.mDat = (proxy *)p_Var1[1]._M_next;
  p_Var1[1]._M_next = (_List_node_base *)0x0;
  std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_erase
            ((list<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,in_RSI->_M_next);
  (this->_list).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->_list).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_28.mDat;
  local_28.mDat = (proxy *)0x0;
  any::recycle(&local_28);
  return (any)(proxy *)this;
}

Assistant:

inline Type pop()
			{
				if (!_taker)
					_taker = current();

				while (_list.empty())
					yield();

				Type obj = std::move(_list.front());
				_list.pop_front();
				return std::move(obj);
			}